

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetMetricGroupCalculateMetricValuesPrologue
          (ZETParameterValidation *this,zet_metric_group_handle_t hMetricGroup,
          zet_metric_group_calculation_type_t type,size_t rawDataSize,uint8_t *pRawData,
          uint32_t *pMetricValueCount,zet_typed_value_t *pMetricValues)

{
  ze_result_t zVar1;
  
  if (hMetricGroup == (zet_metric_group_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
  if ((int)type < 2) {
    if (pRawData == (uint8_t *)0x0) {
      return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    }
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if (pMetricValueCount != (uint32_t *)0x0) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetMetricGroupCalculateMetricValuesPrologue(
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle of the metric group
        zet_metric_group_calculation_type_t type,       ///< [in] calculation type to be applied on raw data
        size_t rawDataSize,                             ///< [in] size in bytes of raw data buffer
        const uint8_t* pRawData,                        ///< [in][range(0, rawDataSize)] buffer of raw data to calculate
        uint32_t* pMetricValueCount,                    ///< [in,out] pointer to number of metric values calculated.
                                                        ///< if count is zero, then the driver shall update the value with the
                                                        ///< total number of metric values to be calculated.
                                                        ///< if count is greater than the number available in the raw data buffer,
                                                        ///< then the driver shall update the value with the actual number of
                                                        ///< metric values to be calculated.
        zet_typed_value_t* pMetricValues                ///< [in,out][optional][range(0, *pMetricValueCount)] buffer of calculated metrics.
                                                        ///< if count is less than the number available in the raw data buffer,
                                                        ///< then driver shall only calculate that number of metric values.
        )
    {
        if( nullptr == hMetricGroup )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( ZET_METRIC_GROUP_CALCULATION_TYPE_MAX_METRIC_VALUES < type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( nullptr == pRawData )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == pMetricValueCount )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }